

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O2

bool __thiscall trimesh::dataset_t::compare_cells<0>(dataset_t *this,cellid_t *c1,cellid_t *c2)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  bool bVar4;
  uint uVar5;
  type ptVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  string local_1d0 [32];
  stringstream ss;
  ostream local_1a0 [376];
  
  ptVar6 = boost::shared_ptr<tri_cc_t>::operator->(&this->m_tcc);
  uVar5 = tri_cc_t::get_cell_dim(ptVar6,*c1);
  if (uVar5 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar7 = std::operator<<(local_1a0,"Failed to assert condition ");
    poVar7 = std::operator<<(poVar7,"m_tcc->get_cell_dim(c1) == 0");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"at (");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                            );
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = std::operator<<(poVar7,"compare_cells");
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x6c);
    std::operator<<(poVar7,") \n ");
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_1d0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ptVar6 = boost::shared_ptr<tri_cc_t>::operator->(&this->m_tcc);
  uVar5 = tri_cc_t::get_cell_dim(ptVar6,*c2);
  if (uVar5 == 0) {
    pdVar3 = (this->m_vert_fns->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = pdVar3[*c1];
    dVar2 = pdVar3[*c2];
    bVar4 = *c1 < *c2;
    if (dVar1 != dVar2) {
      bVar4 = dVar1 < dVar2;
    }
    if (NAN(dVar1) || NAN(dVar2)) {
      bVar4 = dVar1 < dVar2;
    }
    return bVar4;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar7 = std::operator<<(local_1a0,"Failed to assert condition ");
  poVar7 = std::operator<<(poVar7,"m_tcc->get_cell_dim(c2) == 0");
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"at (");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                          );
  poVar7 = std::operator<<(poVar7,",");
  poVar7 = std::operator<<(poVar7,"compare_cells");
  poVar7 = std::operator<<(poVar7,",");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x6d);
  std::operator<<(poVar7,") \n ");
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar8,local_1d0);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline bool dataset_t::compare_cells<0>(const cellid_t & c1, const cellid_t &c2) const
  {
    ASSERT(m_tcc->get_cell_dim(c1) == 0);
    ASSERT(m_tcc->get_cell_dim(c2) == 0);

    fn_t f1 = m_vert_fns[c1];
    fn_t f2 = m_vert_fns[c2];

    if (f1 != f2)
      return f1 < f2;

    return c1 < c2;
  }